

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O2

bool __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::checkSourceTextureSizeAndType
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  ostringstream *stream;
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  MessageBuilder *pMVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  GLint alpha_type;
  GLenum local_284;
  GLenum local_280;
  GLenum local_27c;
  GLenum local_278;
  int local_274;
  int local_270;
  GLenum local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  FunctionalTest *local_258;
  Enum<int,_2UL> local_250;
  Enum<int,_2UL> local_240;
  Enum<int,_2UL> local_230;
  Enum<int,_2UL> local_220;
  Enum<int,_2UL> local_210;
  Enum<int,_2UL> local_200;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  local_268 = 0;
  local_25c = 0;
  local_260 = 0;
  local_264 = 0;
  local_270 = 0;
  local_274 = 0;
  local_278 = 0;
  local_27c = 0;
  local_280 = 0;
  local_284 = 0;
  local_26c = 0;
  local_258 = this;
  (**(code **)(lVar9 + 0xb8))(target,this->m_source_texture);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x1fb);
  (**(code **)(lVar9 + 0xab0))(target,0,0x805c,&local_268);
  (**(code **)(lVar9 + 0xab0))(target,0,0x805d,&local_260);
  (**(code **)(lVar9 + 0xab0))(target,0,0x805e,&local_25c);
  (**(code **)(lVar9 + 0xab0))(target,0,0x805f,&local_264);
  (**(code **)(lVar9 + 0xab0))(target,0,0x884a,&local_270);
  (**(code **)(lVar9 + 0xab0))(target,0,0x88f1,&local_274);
  (**(code **)(lVar9 + 0xab0))(target,0,0x8c10,&local_278);
  (**(code **)(lVar9 + 0xab0))(target,0,0x8c11,&local_27c);
  (**(code **)(lVar9 + 0xab0))(target,0,0x8c12,&local_280);
  (**(code **)(lVar9 + 0xab0))(target,0,0x8c13,&local_284);
  (**(code **)(lVar9 + 0xab0))(target,0,0x8c16,&local_26c);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x20b);
  bVar1 = descriptor.min_red_size <= local_268;
  bVar2 = descriptor.min_green_size <= local_260;
  bVar3 = descriptor.min_blue_size <= local_25c;
  bVar4 = descriptor.min_alpha_size <= local_264;
  bVar5 = descriptor.min_depth_size <= local_270;
  bVar6 = descriptor.min_stencil_size <= local_274;
  bVar11 = local_278 == descriptor.expected_red_type;
  bVar12 = local_27c == descriptor.expected_green_type;
  bVar13 = local_280 == descriptor.expected_blue_type;
  bVar14 = local_284 == descriptor.expected_alpha_type;
  bVar15 = local_26c == descriptor.expected_depth_type;
  if ((!bVar15 || (!bVar14 || (!bVar13 || !bVar12))) ||
      ((!bVar11 || (!bVar6 || !bVar5)) || ((!bVar4 || !bVar3) || (!bVar2 || !bVar1)))) {
    local_1b0._0_8_ = ((local_258->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Promotion from internal format ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,&descriptor.internal_format_name);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " have failed during glGetTexLevelParameteriv query. ");
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    "Expected red size = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&descriptor.min_red_size);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected green size = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&descriptor.min_green_size);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected blue size = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&descriptor.min_blue_size);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected alpha size = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&descriptor.min_alpha_size);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected depth size = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&descriptor.min_depth_size);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected stencil size = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&descriptor.min_stencil_size);
    stream = &pMVar10->m_str;
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ". Queried red size = ");
    std::ostream::operator<<(stream,local_268);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried green size = ");
    std::ostream::operator<<(stream,local_260);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried blue size = ");
    std::ostream::operator<<(stream,local_25c);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried alpha size = ");
    std::ostream::operator<<(stream,local_264);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried depth size = ");
    std::ostream::operator<<(stream,local_270);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried stencil size = ");
    std::ostream::operator<<(stream,local_274);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,". ");
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "Expected red type = ");
    local_1c0.m_getName = glu::getTypeName;
    local_1c0.m_value = descriptor.expected_red_type;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_1c0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected green type = ");
    local_1d0.m_getName = glu::getTypeName;
    local_1d0.m_value = descriptor.expected_green_type;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_1d0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected blue type = ");
    local_1e0.m_getName = glu::getTypeName;
    local_1e0.m_value = descriptor.expected_blue_type;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_1e0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected alpha type = ");
    local_1f0.m_getName = glu::getTypeName;
    local_1f0.m_value = descriptor.expected_alpha_type;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_1f0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected depth type = ");
    local_200.m_getName = glu::getTypeName;
    local_200.m_value = descriptor.expected_depth_type;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_200,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ". Queried red type = ");
    local_210.m_getName = glu::getTypeName;
    local_210.m_value = local_278;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_210,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried green type = ");
    local_220.m_getName = glu::getTypeName;
    local_220.m_value = local_27c;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_220,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried blue type = ");
    local_230.m_getName = glu::getTypeName;
    local_230.m_value = local_280;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_230,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried alpha type = ");
    local_240.m_getName = glu::getTypeName;
    local_240.m_value = local_284;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_240,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", queried depth type = ");
    local_250.m_getName = glu::getTypeName;
    local_250.m_value = local_26c;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_250,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,".");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return (bVar15 && (bVar14 && (bVar13 && bVar12))) &&
         ((bVar11 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool FunctionalTest::checkSourceTextureSizeAndType(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* query result storage */
	glw::GLint red_size		= 0;
	glw::GLint blue_size	= 0;
	glw::GLint green_size   = 0;
	glw::GLint alpha_size   = 0;
	glw::GLint depth_size   = 0;
	glw::GLint stencil_size = 0;

	glw::GLint red_type   = 0;
	glw::GLint green_type = 0;
	glw::GLint blue_type  = 0;
	glw::GLint alpha_type = 0;
	glw::GLint depth_type = 0;

	/* Bind texture */
	gl.bindTexture(target, m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* queries */
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_RED_SIZE, &red_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_GREEN_SIZE, &green_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_BLUE_SIZE, &blue_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_ALPHA_SIZE, &alpha_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_DEPTH_SIZE, &depth_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_STENCIL_SIZE, &stencil_size);

	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_RED_TYPE, &red_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_GREEN_TYPE, &green_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_BLUE_TYPE, &blue_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_ALPHA_TYPE, &alpha_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_DEPTH_TYPE, &depth_type);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* check expected values */
	bool is_ok = true;

	is_ok = is_ok && (red_size >= descriptor.min_red_size);
	is_ok = is_ok && (green_size >= descriptor.min_green_size);
	is_ok = is_ok && (blue_size >= descriptor.min_blue_size);
	is_ok = is_ok && (alpha_size >= descriptor.min_alpha_size);
	is_ok = is_ok && (depth_size >= descriptor.min_depth_size);
	is_ok = is_ok && (stencil_size >= descriptor.min_stencil_size);

	is_ok = is_ok && ((glw::GLenum)red_type == descriptor.expected_red_type);
	is_ok = is_ok && ((glw::GLenum)green_type == descriptor.expected_green_type);
	is_ok = is_ok && ((glw::GLenum)blue_type == descriptor.expected_blue_type);
	is_ok = is_ok && ((glw::GLenum)alpha_type == descriptor.expected_alpha_type);
	is_ok = is_ok && ((glw::GLenum)depth_type == descriptor.expected_depth_type);

	/* Log on failure. */
	if (!is_ok)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Promotion from internal format " << descriptor.internal_format_name
			<< " have failed during glGetTexLevelParameteriv query. "
			<< "Expected red size = " << descriptor.min_red_size
			<< ", expected green size = " << descriptor.min_green_size
			<< ", expected blue size = " << descriptor.min_blue_size
			<< ", expected alpha size = " << descriptor.min_alpha_size
			<< ", expected depth size = " << descriptor.min_depth_size
			<< ", expected stencil size = " << descriptor.min_stencil_size << ". Queried red size = " << red_size
			<< ", queried green size = " << green_size << ", queried blue size = " << blue_size
			<< ", queried alpha size = " << alpha_size << ", queried depth size = " << depth_size
			<< ", queried stencil size = " << stencil_size << ". "
			<< "Expected red type = " << glu::getTypeStr(descriptor.expected_red_type)
			<< ", expected green type = " << glu::getTypeStr(descriptor.expected_green_type)
			<< ", expected blue type = " << glu::getTypeStr(descriptor.expected_blue_type)
			<< ", expected alpha type = " << glu::getTypeStr(descriptor.expected_alpha_type)
			<< ", expected depth type = " << glu::getTypeStr(descriptor.expected_depth_type)
			<< ". Queried red type = " << glu::getTypeStr(red_type)
			<< ", queried green type = " << glu::getTypeStr(green_type)
			<< ", queried blue type = " << glu::getTypeStr(blue_type)
			<< ", queried alpha type = " << glu::getTypeStr(alpha_type)
			<< ", queried depth type = " << glu::getTypeStr(depth_type) << "." << tcu::TestLog::EndMessage;
	}

	/* return results. */
	return is_ok;
}